

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
HdlcSimulationDataGenerator::GenFcs
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          HdlcSimulationDataGenerator *this,HdlcFcsType fcsType,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  undefined1 local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *stream_local;
  HdlcSimulationDataGenerator *pHStack_18;
  HdlcFcsType fcsType_local;
  HdlcSimulationDataGenerator *this_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *crcRet;
  
  local_29 = 0;
  local_28 = stream;
  stream_local._4_4_ = fcsType;
  pHStack_18 = this;
  this_local = (HdlcSimulationDataGenerator *)__return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if (stream_local._4_4_ == HDLC_CRC8) {
    Crc8(&local_48,local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_48);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
  }
  else if (stream_local._4_4_ == HDLC_CRC16) {
    Crc16(&local_70,local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_70);
  }
  else if (stream_local._4_4_ == HDLC_CRC32) {
    Crc32(&local_88,local_28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (__return_storage_ptr__,&local_88);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::GenFcs( HdlcFcsType fcsType, const vector<U8>& stream ) const
{
    vector<U8> crcRet;
    switch( fcsType )
    {
    case HDLC_CRC8:
        crcRet = Crc8( stream );
        break;
    case HDLC_CRC16:
        crcRet = Crc16( stream );
        break;
    case HDLC_CRC32:
        crcRet = Crc32( stream );
        break;
    }
    return crcRet;
}